

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPartSat.c
# Opt level: O0

void Aig_ManDeriveCounterExample(Aig_Man_t *p,Vec_Int_t *vNode2Var,sat_solver *pSat)

{
  int iVar1;
  Vec_Int_t *p_00;
  Aig_Obj_t *pObj_00;
  int *piVar2;
  int local_34;
  int i;
  Aig_Obj_t *pObj;
  Vec_Int_t *vPisIds;
  sat_solver *pSat_local;
  Vec_Int_t *vNode2Var_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManCiNum(p);
  p_00 = Vec_IntAlloc(iVar1);
  for (local_34 = 0; iVar1 = Vec_PtrSize(p->vCis), local_34 < iVar1; local_34 = local_34 + 1) {
    pObj_00 = (Aig_Obj_t *)Vec_PtrEntry(p->vCis,local_34);
    iVar1 = Aig_ObjId(pObj_00);
    iVar1 = Vec_IntEntry(vNode2Var,iVar1);
    Vec_IntPush(p_00,iVar1);
  }
  piVar2 = Sat_SolverGetModel(pSat,p_00->pArray,p_00->nSize);
  p->pData = piVar2;
  Vec_IntFree(p_00);
  return;
}

Assistant:

void Aig_ManDeriveCounterExample( Aig_Man_t * p, Vec_Int_t * vNode2Var, sat_solver * pSat )
{ 
    Vec_Int_t * vPisIds;
    Aig_Obj_t * pObj;
    int i;
    // collect IDs of PI variables
    // (fanoutless PIs have SAT var 0, which is an unused in the SAT solver -> has value 0)
    vPisIds = Vec_IntAlloc( Aig_ManCiNum(p) );
    Aig_ManForEachCi( p, pObj, i )
        Vec_IntPush( vPisIds, Vec_IntEntry(vNode2Var, Aig_ObjId(pObj)) );
    // derive the SAT assignment
    p->pData = Sat_SolverGetModel( pSat, vPisIds->pArray, vPisIds->nSize );
    Vec_IntFree( vPisIds );
}